

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynBase * ParseType(ParseContext *ctx,bool *shrBorrow,bool onlyType)

{
  SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U> *this;
  LexemeType LVar1;
  Lexeme *begin;
  bool bVar2;
  int iVar3;
  bool *pbVar4;
  SynBase *pSVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Lexeme *end;
  undefined7 in_register_00000011;
  Lexeme *sizeStart;
  Lexeme *pLVar6;
  bool shrBorrowTerminal;
  IntrusiveList<SynBase> sizes;
  bool local_82;
  bool local_81;
  SynBase *local_80;
  SynBase *local_78;
  uint local_6c;
  IntrusiveList<SynBase> local_68;
  undefined4 local_4c;
  SynBase *local_48;
  SynBase *pSStack_40;
  SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U> *local_38;
  
  begin = ctx->currentLexeme;
  this = &ctx->nonTypeLocations;
  local_68.head =
       (SynBase *)
       CONCAT44(local_68.head._4_4_,(int)((ulong)((long)begin - (long)ctx->firstLexeme) >> 5) + 1);
  pbVar4 = SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::find
                     (this,(uint *)&local_68);
  if (pbVar4 != (bool *)0x0) {
    return (SynBase *)0x0;
  }
  if (shrBorrow == (bool *)0x0) {
    local_81 = false;
  }
  else {
    local_81 = *shrBorrow;
  }
  local_80 = ParseTerminalType(ctx,&local_81);
  if (local_80 == (SynBase *)0x0) {
LAB_00113e7e:
    local_78 = (SynBase *)0x0;
  }
  else {
    if (local_81 == true) {
      if (shrBorrow == (bool *)0x0) {
        ctx->currentLexeme = begin;
        local_68.head =
             (SynBase *)
             CONCAT44(local_68.head._4_4_,
                      (int)((ulong)((long)begin - (long)ctx->firstLexeme) >> 5) + 1);
        local_6c = CONCAT31(local_6c._1_3_,1);
        SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::insert
                  (this,(uint *)&local_68,(bool *)&local_6c);
        goto LAB_00113e7e;
      }
      *shrBorrow = true;
    }
    local_4c = (undefined4)CONCAT71(in_register_00000011,onlyType);
    local_38 = this;
    do {
      while( true ) {
        pLVar6 = ctx->currentLexeme;
        if (pLVar6->type == lex_ref) break;
        if (pLVar6->type != lex_obracket) {
          return local_80;
        }
        local_68.head = (SynBase *)0x0;
        local_68.tail = (SynBase *)0x0;
        do {
          LVar1 = ctx->currentLexeme->type;
          if (LVar1 != lex_obracket) {
            iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
            pSVar5 = (SynBase *)CONCAT44(extraout_var_01,iVar3);
            if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00113e9b;
            local_48 = local_68.head;
            pSStack_40 = local_68.tail;
            SynBase::SynBase(pSVar5,9,begin,ctx->currentLexeme + -1);
            pSVar5->_vptr_SynBase = (_func_int **)&PTR__SynBase_002472c8;
            pSVar5[1]._vptr_SynBase = (_func_int **)local_80;
            *(SynBase **)&pSVar5[1].typeID = local_48;
            pSVar5[1].begin = (Lexeme *)pSStack_40;
            local_80 = pSVar5;
            break;
          }
          pLVar6 = ctx->currentLexeme + 1;
          ctx->currentLexeme = pLVar6;
          pSVar5 = ParseTernaryExpr(ctx);
          if ((pSVar5 == (SynBase *)0x0) || (ctx->currentLexeme->type == lex_cbracket)) {
            bVar2 = anon_unknown.dwarf_15703::CheckConsume
                              (ctx,lex_cbracket,"ERROR: matching \']\' not found");
            if (pSVar5 == (SynBase *)0x0) {
              iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
              pSVar5 = (SynBase *)CONCAT44(extraout_var,iVar3);
              end = ctx->currentLexeme;
              if (bVar2) {
                if (end <= ctx->firstLexeme) goto LAB_00113e9b;
                end = end + -1;
              }
              SynBase::SynBase(pSVar5,3,pLVar6,end);
              pSVar5->_vptr_SynBase = (_func_int **)&PTR__SynBase_00247290;
            }
            IntrusiveList<SynBase>::push_back(&local_68,pSVar5);
            bVar2 = true;
          }
          else {
            if ((char)local_4c != '\0') {
              anon_unknown.dwarf_15703::Report
                        (ctx,ctx->currentLexeme,"ERROR: \']\' not found after expression");
            }
            ctx->currentLexeme = begin;
            local_6c = (int)((ulong)((long)begin - (long)ctx->firstLexeme) >> 5) + 1;
            local_82 = true;
            SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::insert
                      (local_38,&local_6c,&local_82);
            bVar2 = false;
            local_78 = (SynBase *)0x0;
          }
        } while (bVar2);
        if (LVar1 == lex_obracket) {
          return local_78;
        }
      }
      ctx->currentLexeme = pLVar6 + 1;
      if (pLVar6[1].type == lex_oparen) {
        ctx->currentLexeme = pLVar6 + 2;
        local_68.head = (SynBase *)0x0;
        local_68.tail = (SynBase *)0x0;
        pSVar5 = ParseType(ctx,(bool *)0x0,false);
        if (pSVar5 != (SynBase *)0x0) {
          do {
            IntrusiveList<SynBase>::push_back(&local_68,pSVar5);
            if (ctx->currentLexeme->type != lex_comma) goto LAB_00113c87;
            ctx->currentLexeme = ctx->currentLexeme + 1;
            pSVar5 = ParseType(ctx,(bool *)0x0,false);
          } while (pSVar5 != (SynBase *)0x0);
          anon_unknown.dwarf_15703::Report
                    (ctx,ctx->currentLexeme,"ERROR: type is expected after \',\'");
        }
LAB_00113c87:
        bVar2 = ctx->currentLexeme->type == lex_cparen;
        if (bVar2) {
          ctx->currentLexeme = ctx->currentLexeme + 1;
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
          pSVar5 = (SynBase *)CONCAT44(extraout_var_00,iVar3);
          if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00113e9b;
          local_48 = local_68.head;
          pSStack_40 = local_68.tail;
          SynBase::SynBase(pSVar5,0xb,begin,ctx->currentLexeme + -1);
          pSVar5->_vptr_SynBase = (_func_int **)&PTR__SynBase_00247338;
          pSVar5[1]._vptr_SynBase = (_func_int **)local_80;
          *(SynBase **)&pSVar5[1].typeID = local_48;
          pSVar5[1].begin = (Lexeme *)pSStack_40;
          local_80 = pSVar5;
        }
        else {
          ctx->currentLexeme = pLVar6 + 1;
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
          pSVar5 = (SynBase *)CONCAT44(extraout_var_03,iVar3);
          if (ctx->currentLexeme <= ctx->firstLexeme) {
LAB_00113e9b:
            __assert_fail("currentLexeme > firstLexeme",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                          ,0x19c,"Lexeme *ParseContext::Previous()");
          }
          SynBase::SynBase(pSVar5,10,begin,ctx->currentLexeme + -1);
          pSVar5->_vptr_SynBase = (_func_int **)&PTR__SynBase_00247300;
          pSVar5[1]._vptr_SynBase = (_func_int **)local_80;
          local_78 = pSVar5;
        }
      }
      else {
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
        pSVar5 = (SynBase *)CONCAT44(extraout_var_02,iVar3);
        if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00113e9b;
        SynBase::SynBase(pSVar5,10,begin,ctx->currentLexeme + -1);
        pSVar5->_vptr_SynBase = (_func_int **)&PTR__SynBase_00247300;
        pSVar5[1]._vptr_SynBase = (_func_int **)local_80;
        bVar2 = true;
        local_80 = pSVar5;
      }
    } while (bVar2);
  }
  return local_78;
}

Assistant:

SynBase* ParseType(ParseContext &ctx, bool *shrBorrow, bool onlyType)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.nonTypeLocations.find(unsigned(start - ctx.firstLexeme) + 1))
		return NULL;

	bool shrBorrowTerminal = shrBorrow ? *shrBorrow : false;

	SynBase *base = ParseTerminalType(ctx, shrBorrowTerminal);
	
	if(!base)
		return NULL;

	if(shrBorrowTerminal)
	{
		if(!shrBorrow)
		{
			// Backtrack
			ctx.currentLexeme = start;
			ctx.nonTypeLocations.insert(unsigned(start - ctx.firstLexeme) + 1, true);

			return NULL;
		}
		else
		{
			*shrBorrow = true;
		}
	}

	while(ctx.At(lex_obracket) || ctx.At(lex_ref))
	{
		if(ctx.At(lex_obracket))
		{
			IntrusiveList<SynBase> sizes;

			while(ctx.Consume(lex_obracket))
			{
				Lexeme *sizeStart = ctx.currentLexeme;

				SynBase *size = ParseTernaryExpr(ctx);

				if(size && !ctx.At(lex_cbracket))
				{
					if(onlyType)
						Report(ctx, ctx.Current(), "ERROR: ']' not found after expression");

					// Backtrack
					ctx.currentLexeme = start;
					ctx.nonTypeLocations.insert(unsigned(start - ctx.firstLexeme) + 1, true);

					return NULL;
				}

				bool hasClose = CheckConsume(ctx, lex_cbracket, "ERROR: matching ']' not found");

				if(size)
					sizes.push_back(size);
				else
					sizes.push_back(new (ctx.get<SynNothing>()) SynNothing(sizeStart, hasClose ? ctx.Previous() : ctx.Current()));
			}

			base = new (ctx.get<SynTypeArray>()) SynTypeArray(start, ctx.Previous(), base, sizes);
		}
		else if(ctx.Consume(lex_ref))
		{
			Lexeme *refLexeme = ctx.currentLexeme;

			if(ctx.Consume(lex_oparen))
			{
				IntrusiveList<SynBase> arguments;

				if(SynBase *argument = ParseType(ctx))
				{
					arguments.push_back(argument);

					while(ctx.Consume(lex_comma))
					{
						argument = ParseType(ctx);

						if(!argument)
						{
							Report(ctx, ctx.Current(), "ERROR: type is expected after ','");

							break;
						}

						arguments.push_back(argument);
					}
				}

				if(!ctx.Consume(lex_cparen))
				{
					// Backtrack
					ctx.currentLexeme = refLexeme;

					return new (ctx.get<SynTypeReference>()) SynTypeReference(start, ctx.Previous(), base);
				}

				base = new (ctx.get<SynTypeFunction>()) SynTypeFunction(start, ctx.Previous(), base, arguments);
			}
			else
			{
				base = new (ctx.get<SynTypeReference>()) SynTypeReference(start, ctx.Previous(), base);
			}
		}
	}

	return base;
}